

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# makeTiled.cpp
# Opt level: O0

void anon_unknown.dwarf_16f66::reduceX<Imath_3_2::half>
               (TypedImageChannel<Imath_3_2::half> *channel0,
               TypedImageChannel<Imath_3_2::half> *channel1,bool filter,Extrapolation *ext,bool odd)

{
  int iVar1;
  int iVar2;
  int iVar3;
  Image *pIVar4;
  half *phVar5;
  byte in_DL;
  ImageChannel *in_RSI;
  ImageChannel *in_RDI;
  byte in_R8B;
  int x_1;
  int y_1;
  int offset;
  int x;
  int y;
  double f;
  int h1;
  int w1;
  int w0;
  half *in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffa4;
  TypedImageChannel<Imath_3_2::half> *local_58;
  Extrapolation in_stack_ffffffffffffffb0;
  int iVar6;
  int in_stack_ffffffffffffffb4;
  int iVar7;
  undefined4 in_stack_ffffffffffffffb8;
  undefined2 in_stack_ffffffffffffffbc;
  half in_stack_ffffffffffffffbe;
  int local_40;
  
  pIVar4 = ImageChannel::image(in_RDI);
  iVar1 = Image::width(pIVar4);
  pIVar4 = ImageChannel::image(in_RSI);
  iVar2 = Image::width(pIVar4);
  pIVar4 = ImageChannel::image(in_RSI);
  iVar3 = Image::height(pIVar4);
  if ((in_DL & 1) == 0) {
    if ((in_R8B & 1) == 0) {
      iVar1 = 0;
    }
    else {
      iVar1 = iVar1 + -1 + (iVar2 + -1) * -2;
    }
    for (iVar7 = 0; iVar7 < iVar3; iVar7 = iVar7 + 1) {
      for (iVar6 = 0; iVar6 < iVar2; iVar6 = iVar6 + 1) {
        in_stack_ffffffffffffff98 =
             TypedImageChannel<Imath_3_2::half>::operator()
                       ((TypedImageChannel<Imath_3_2::half> *)
                        CONCAT44(iVar1,in_stack_ffffffffffffffa0),
                        (int)((ulong)in_stack_ffffffffffffff98 >> 0x20),
                        (int)in_stack_ffffffffffffff98);
        phVar5 = TypedImageChannel<Imath_3_2::half>::operator()
                           ((TypedImageChannel<Imath_3_2::half> *)
                            CONCAT44(iVar1,in_stack_ffffffffffffffa0),
                            (int)((ulong)in_stack_ffffffffffffff98 >> 0x20),
                            (int)in_stack_ffffffffffffff98);
        phVar5->_h = in_stack_ffffffffffffff98->_h;
      }
    }
  }
  else {
    if (iVar2 < 2) {
      local_58 = (TypedImageChannel<Imath_3_2::half> *)0x3ff0000000000000;
    }
    else {
      local_58 = (TypedImageChannel<Imath_3_2::half> *)((double)(iVar1 + -2) / (double)(iVar2 + -1))
      ;
    }
    for (iVar1 = 0; iVar1 < iVar3; iVar1 = iVar1 + 1) {
      for (local_40 = 0; local_40 < iVar2; local_40 = local_40 + 1) {
        in_stack_ffffffffffffffbe =
             filterX<Imath_3_2::half>
                       (local_58,iVar1,
                        (double)CONCAT26(in_stack_ffffffffffffffbe._h,
                                         CONCAT24(in_stack_ffffffffffffffbc,
                                                  in_stack_ffffffffffffffb8)),
                        in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0);
        phVar5 = TypedImageChannel<Imath_3_2::half>::operator()
                           ((TypedImageChannel<Imath_3_2::half> *)
                            CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                            (int)((ulong)in_stack_ffffffffffffff98 >> 0x20),
                            (int)in_stack_ffffffffffffff98);
        phVar5->_h = in_stack_ffffffffffffffbe._h;
      }
    }
  }
  return;
}

Assistant:

void
reduceX (
    const TypedImageChannel<T>& channel0,
    TypedImageChannel<T>&       channel1,
    bool                        filter,
    Extrapolation&              ext,
    bool                        odd)
{
    //
    // Shrink an image channel, channel0, horizontally
    // by a factor of 2, and store the result in channel1.
    //

    int w0 = channel0.image ().width ();
    int w1 = channel1.image ().width ();
    int h1 = channel1.image ().height ();

    if (filter)
    {
        //
        // Low-pass filter and resample.
        // For pixels (0, y) and (w1 - 1, y) in channel 1,
        // the low-pass filter in channel0 is centered on
        // pixels (0.5, y) and (w0 - 1.5, y) respectively.
        //

        double f = (w1 > 1) ? double (w0 - 2) / (w1 - 1) : 1;

        for (int y = 0; y < h1; ++y)
            for (int x = 0; x < w1; ++x)
                channel1 (x, y) = filterX (channel0, w0, x * f, y, ext);
    }
    else
    {
        //
        // Resample, skipping every other pixel, without
        // low-pass filtering.  In order to keep the image
        // from sliding to the right if the channel is
        // resampled repeatedly, we skip the rightmost
        // pixel of every row on even passes, and the
        // leftmost pixel on odd passes.
        //

        int offset = odd ? ((w0 - 1) - 2 * (w1 - 1)) : 0;

        for (int y = 0; y < h1; ++y)
            for (int x = 0; x < w1; ++x)
                channel1 (x, y) = channel0 (2 * x + offset, y);
    }
}